

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planner.cpp
# Opt level: O0

void AI::evaluatePlan(Plan *plan,WorldState *currentState,WorldQuerier *worldQuerySystem,
                     TaskParameters *parameters,
                     vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
                     *satisfiablePredicates)

{
  TaskIdentifier TVar1;
  TaskParameters *__args_1;
  WorldQuerier *pWVar2;
  WorldState *this;
  bool bVar3;
  pointer pTVar4;
  reference pTVar5;
  reference pTVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_388;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string local_2e8;
  TaskIdentifier *local_2c8;
  Task *local_2c0;
  __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_> local_2b8;
  __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_> local_228;
  Task *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  reference local_158;
  value_type *parent;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  TaskIdentifier *local_d0;
  Task *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_> *local_30;
  vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
  *satisfiablePredicates_local;
  TaskParameters *parameters_local;
  WorldQuerier *worldQuerySystem_local;
  WorldState *currentState_local;
  Plan *plan_local;
  
  local_30 = satisfiablePredicates;
  satisfiablePredicates_local =
       (vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_> *)parameters;
  parameters_local = (TaskParameters *)worldQuerySystem;
  worldQuerySystem_local = (WorldQuerier *)currentState;
  currentState_local = (WorldState *)plan;
  pTVar4 = __gnu_cxx::
           __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
           operator->(&plan->currentTask);
  if (pTVar4->type != Simple) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    pWVar2 = worldQuerySystem_local;
    pTVar5 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator*((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                        *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_left);
    bVar3 = Condition::isTrue(&pTVar4->preconditions,(WorldState *)pWVar2,pTVar5,local_30,false);
    if (!bVar3) {
      WorldQuerier::getName_abi_cxx11_(&local_50,(WorldQuerier *)parameters_local);
      pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                           *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header
                              ._M_header._M_left);
      std::__cxx11::string::string((string *)&local_70,(string *)&pTVar4->debugName);
      log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                ("[",&local_50,"] ","Compound task: ",&local_70," preconditions were not met");
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      *(undefined1 *)
       &(currentState_local->current).vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
           = 1;
      return;
    }
    WorldQuerier::getName_abi_cxx11_(&local_a0,(WorldQuerier *)parameters_local);
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    std::__cxx11::string::string((string *)&local_c0,(string *)&pTVar4->debugName);
    log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
              ("[",&local_a0,"] ","skipping non-simple task: ",&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    bVar3 = std::function::operator_cast_to_bool((function *)&pTVar4->setup);
    if (bVar3) {
      pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                           *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header
                              ._M_header._M_left);
      pTVar5 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator*((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                          *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_left);
      std::function<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&)>::operator()
                (&pTVar4->setup,pTVar5,(WorldState *)worldQuerySystem_local,
                 (WorldQuerier *)parameters_local);
    }
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    bVar3 = std::function::operator_cast_to_bool((function *)&pTVar4->loop);
    if (bVar3) {
      pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                           *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header
                              ._M_header._M_left);
      pWVar2 = worldQuerySystem_local;
      __args_1 = parameters_local;
      pTVar5 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator*((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                          *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_left);
      std::function<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&)>::operator()
                (&pTVar4->loop,(WorldState *)pWVar2,(WorldQuerier *)__args_1,pTVar5);
    }
    local_c8 = (Task *)__gnu_cxx::
                       __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                       ::operator++((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                                     *)&(currentState_local->current).flags._M_t._M_impl.
                                        super__Rb_tree_header._M_header._M_left,0);
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    if (pTVar4->identifier != Null) {
      pTVar6 = __gnu_cxx::
               __normal_iterator<AI::TaskIdentifier_*,_std::vector<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>_>
               ::operator*((__normal_iterator<AI::TaskIdentifier_*,_std::vector<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>_>
                            *)&(currentState_local->current).values._M_t._M_impl.
                               super__Rb_tree_header);
      TVar1 = *pTVar6;
      pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                           *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header
                              ._M_header._M_left);
      if (TVar1 != pTVar4->identifier) {
        local_d0 = (TaskIdentifier *)
                   __gnu_cxx::
                   __normal_iterator<AI::TaskIdentifier_*,_std::vector<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>_>
                   ::operator++((__normal_iterator<AI::TaskIdentifier_*,_std::vector<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>_>
                                 *)&(currentState_local->current).values._M_t._M_impl.
                                    super__Rb_tree_header,0);
      }
    }
    WorldQuerier::getName_abi_cxx11_(&local_f0,(WorldQuerier *)parameters_local);
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    std::__cxx11::string::string((string *)&local_110,(string *)&pTVar4->debugName);
    log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
              ("[",&local_f0,"] ","Started task: ",&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    bVar3 = std::function::operator_cast_to_bool((function *)&pTVar4->setup);
    if (!bVar3) {
      return;
    }
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    pTVar5 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator*((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                        *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_left);
    std::function<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&)>::operator()
              (&pTVar4->setup,pTVar5,(WorldState *)worldQuerySystem_local,
               (WorldQuerier *)parameters_local);
    return;
  }
  pTVar4 = __gnu_cxx::
           __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
           operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                       *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                          _M_header._M_left);
  pWVar2 = worldQuerySystem_local;
  pTVar5 = __gnu_cxx::
           __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
           operator*((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                      *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                         _M_header._M_left);
  bVar3 = Condition::isTrue(&pTVar4->postconditions,(WorldState *)pWVar2,pTVar5,local_30,false);
  if (!bVar3) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    bVar3 = Condition::isEmpty(&pTVar4->breakConditions);
    if (bVar3) goto LAB_001bd72b;
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    pWVar2 = worldQuerySystem_local;
    pTVar5 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator*((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                        *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_left);
    bVar3 = Condition::isTrue(&pTVar4->breakConditions,(WorldState *)pWVar2,pTVar5,local_30,false);
    if (!bVar3) goto LAB_001bd72b;
  }
  pTVar4 = __gnu_cxx::
           __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
           operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                       *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                          _M_header._M_left);
  if ((pTVar4->failed & 1U) == 0) {
    WorldQuerier::getName_abi_cxx11_(&local_130,(WorldQuerier *)parameters_local);
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    std::__cxx11::string::string((string *)&parent,(string *)&pTVar4->debugName);
    log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
              ("[",&local_130,"] ","Finished task: ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parent);
    std::__cxx11::string::~string((string *)&parent);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    bVar3 = std::function::operator_cast_to_bool((function *)&pTVar4->finish);
    if (bVar3) {
      pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                           *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header
                              ._M_header._M_left);
      pWVar2 = worldQuerySystem_local;
      pTVar5 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator*((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                          *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_left);
      std::function<void_(AI::WorldState_&,_AI::Task_&)>::operator()
                (&pTVar4->finish,(WorldState *)pWVar2,pTVar5);
    }
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    this = currentState_local;
    if (pTVar4->parentTaskIndex != -1) {
      pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                           *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header
                              ._M_header._M_left);
      local_158 = std::vector<AI::Task,_std::allocator<AI::Task>_>::operator[]
                            ((vector<AI::Task,_std::allocator<AI::Task>_> *)this,
                             (long)pTVar4->parentTaskIndex);
      if (local_158->type == Abstract) {
        bVar3 = Condition::isTrue(&local_158->postconditions,(WorldState *)worldQuerySystem_local,
                                  local_158,local_30,false);
        if (!bVar3) {
          WorldQuerier::getName_abi_cxx11_(&local_178,(WorldQuerier *)parameters_local);
          std::__cxx11::string::string((string *)&local_198,(string *)&local_158->debugName);
          log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                    ("[",&local_178,"] ","Abstract task: ",&local_198,
                     " finished but its postconditions are not met");
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_178);
          *(undefined1 *)
           &(currentState_local->current).vectors._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_parent = 1;
          return;
        }
      }
      else if ((local_158->type == Compound) &&
              (pTVar4 = __gnu_cxx::
                        __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                        ::operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                                      *)&(currentState_local->current).flags._M_t._M_impl.
                                         super__Rb_tree_header._M_header._M_left),
              (pTVar4->isLastInCompound & 1U) != 0)) {
        bVar3 = Condition::isTrue(&local_158->postconditions,(WorldState *)worldQuerySystem_local,
                                  local_158,local_30,false);
        if (!bVar3) {
          WorldQuerier::getName_abi_cxx11_(&local_1b8,(WorldQuerier *)parameters_local);
          std::__cxx11::string::string((string *)&local_1d8,(string *)&local_158->debugName);
          log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                    ("[",&local_1b8,"] ","Compound task: ",&local_1d8,
                     " finished but its postconditions were not met");
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1b8);
          *(undefined1 *)
           &(currentState_local->current).vectors._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_parent = 1;
          return;
        }
      }
      else if ((local_158->type == Recursive) &&
              (pTVar4 = __gnu_cxx::
                        __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                        ::operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                                      *)&(currentState_local->current).flags._M_t._M_impl.
                                         super__Rb_tree_header._M_header._M_left),
              (pTVar4->isLastInCompound & 1U) != 0)) {
        bVar3 = Condition::isTrue(&local_158->postconditions,(WorldState *)worldQuerySystem_local,
                                  local_158,local_30,false);
        if (!bVar3) {
          if (0 < local_158->remainingRepeats) {
            local_158->remainingRepeats = local_158->remainingRepeats + -1;
            WorldQuerier::getName_abi_cxx11_(&local_1f8,(WorldQuerier *)parameters_local);
            std::__cxx11::string::string((string *)&local_218,(string *)&local_158->debugName);
            log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                      ("[",&local_1f8,"] ","Recursive task: ",&local_218,
                       " finished, starting over since postconditions were not met");
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_1f8);
            local_228._M_current =
                 (Task *)std::begin<std::vector<AI::Task,std::allocator<AI::Task>>>
                                   ((vector<AI::Task,_std::allocator<AI::Task>_> *)
                                    currentState_local);
            pTVar4 = __gnu_cxx::
                     __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                     ::operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                                   *)&(currentState_local->current).flags._M_t._M_impl.
                                      super__Rb_tree_header._M_header._M_left);
            local_220 = (Task *)__gnu_cxx::
                                __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                                ::operator+(&local_228,(long)pTVar4->parentTaskIndex);
            (currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                 = (_Base_ptr)local_220;
            evaluatePlan((Plan *)currentState_local,(WorldState *)worldQuerySystem_local,
                         (WorldQuerier *)parameters_local,
                         (TaskParameters *)satisfiablePredicates_local,local_30);
            return;
          }
          WorldQuerier::getName_abi_cxx11_(&local_248,(WorldQuerier *)parameters_local);
          std::__cxx11::string::string((string *)&local_268,(string *)&local_158->debugName);
          log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                    ("[",&local_248,"] ","Recursive task: ",&local_268,
                     " failed, postconditions not met and remainingRepeats");
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_248);
          *(undefined1 *)
           &(currentState_local->current).vectors._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_parent = 1;
          return;
        }
        WorldQuerier::getName_abi_cxx11_(&local_288,(WorldQuerier *)parameters_local);
        std::__cxx11::string::string((string *)&local_2a8,(string *)&local_158->debugName);
        log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                  ("[",&local_288,"] ","Recursive task: ",&local_2a8," has finished");
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_288);
      }
    }
    local_2b0 = __gnu_cxx::
                __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
                operator+((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                           *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header
                              ._M_header._M_left,1);
    local_2b8._M_current =
         (Task *)std::end<std::vector<AI::Task,std::allocator<AI::Task>>>
                           ((vector<AI::Task,_std::allocator<AI::Task>_> *)currentState_local);
    bVar3 = __gnu_cxx::operator<(&local_2b0,&local_2b8);
    if (!bVar3) {
      WorldQuerier::getName_abi_cxx11_(&local_368,(WorldQuerier *)parameters_local);
      log<char_const*,std::__cxx11::string,char_const*,char_const*>
                ("[",&local_368,"] ","Plan finished successfully");
      std::__cxx11::string::~string((string *)&local_368);
      *(undefined1 *)
       &(currentState_local->current).vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
           = 0;
      *(undefined1 *)
       ((long)&(currentState_local->current).vectors._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent + 1) = 1;
      return;
    }
    local_2c0 = (Task *)__gnu_cxx::
                        __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                        ::operator++((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                                      *)&(currentState_local->current).flags._M_t._M_impl.
                                         super__Rb_tree_header._M_header._M_left,0);
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    if (pTVar4->identifier != Null) {
      pTVar6 = __gnu_cxx::
               __normal_iterator<AI::TaskIdentifier_*,_std::vector<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>_>
               ::operator*((__normal_iterator<AI::TaskIdentifier_*,_std::vector<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>_>
                            *)&(currentState_local->current).values._M_t._M_impl.
                               super__Rb_tree_header);
      TVar1 = *pTVar6;
      pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                           *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header
                              ._M_header._M_left);
      if (TVar1 != pTVar4->identifier) {
        local_2c8 = (TaskIdentifier *)
                    __gnu_cxx::
                    __normal_iterator<AI::TaskIdentifier_*,_std::vector<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>_>
                    ::operator++((__normal_iterator<AI::TaskIdentifier_*,_std::vector<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>_>
                                  *)&(currentState_local->current).values._M_t._M_impl.
                                     super__Rb_tree_header,0);
      }
    }
    WorldQuerier::getName_abi_cxx11_(&local_2e8,(WorldQuerier *)parameters_local);
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    std::__cxx11::string::string((string *)&local_308,(string *)&pTVar4->debugName);
    log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
              ("[",&local_2e8,"] ","Started task: ",&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2e8);
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    bVar3 = std::function::operator_cast_to_bool((function *)&pTVar4->setup);
    if (bVar3) {
      pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                           *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header
                              ._M_header._M_left);
      pTVar5 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator*((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                          *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_left);
      std::function<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&)>::operator()
                (&pTVar4->setup,pTVar5,(WorldState *)worldQuerySystem_local,
                 (WorldQuerier *)parameters_local);
    }
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    pWVar2 = worldQuerySystem_local;
    pTVar5 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator*((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                        *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_left);
    bVar3 = Condition::isTrue(&pTVar4->preconditions,(WorldState *)pWVar2,pTVar5,local_30,false);
    if (bVar3) {
      return;
    }
    WorldQuerier::getName_abi_cxx11_(&local_328,(WorldQuerier *)parameters_local);
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    std::__cxx11::string::string((string *)&local_348,(string *)&pTVar4->debugName);
    log<char_const*,std::__cxx11::string,char_const*,std::__cxx11::string,char_const*>
              ("[",&local_328,"] ",&local_348," preconditions false, plan failed");
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_328);
    *(undefined1 *)
     &(currentState_local->current).vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         1;
    return;
  }
LAB_001bd72b:
  pTVar4 = __gnu_cxx::
           __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
           operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                       *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                          _M_header._M_left);
  pWVar2 = worldQuerySystem_local;
  pTVar5 = __gnu_cxx::
           __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
           operator*((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                      *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                         _M_header._M_left);
  bVar3 = Condition::isTrue(&pTVar4->preconditions,(WorldState *)pWVar2,pTVar5,local_30,false);
  if (((!bVar3) ||
      (pTVar4 = __gnu_cxx::
                __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
                operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                            *)&(currentState_local->current).flags._M_t._M_impl.
                               super__Rb_tree_header._M_header._M_left),
      (pTVar4->isImmediate & 1U) != 0)) ||
     (pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                           *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header
                              ._M_header._M_left), (pTVar4->failed & 1U) != 0)) {
    WorldQuerier::getName_abi_cxx11_(&local_388,(WorldQuerier *)parameters_local);
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->((__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>
                         *)&(currentState_local->current).flags._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left);
    std::__cxx11::string::string((string *)&local_3a8,(string *)&pTVar4->debugName);
    log<char_const*,std::__cxx11::string,char_const*,std::__cxx11::string,char_const*>
              ("[",&local_388,"] ",&local_3a8," preconditions false, plan failed");
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_388);
    *(undefined1 *)
     &(currentState_local->current).vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         1;
  }
  return;
}

Assistant:

void evaluatePlan(Plan& plan, WorldState& currentState, WorldQuerier const& worldQuerySystem, TaskParameters& parameters, std::vector<SatisfiablePredicate>& satisfiablePredicates)
	{
		//is this an abstract or compound/.recursive task? they don't have any actions, so we can skip ahead		
		if (plan.currentTask->type != TaskType::Simple)			
		{
			if (!plan.currentTask->preconditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates))
			{
				log("[", worldQuerySystem.getName(), "] ", "Compound task: ", plan.currentTask->debugName, " preconditions were not met");
				plan.failed = true;
				return;
			}

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
			log("[", worldQuerySystem.getName(), "] ", "skipping non-simple task: ", plan.currentTask->debugName);
#endif

			if (plan.currentTask->setup)
			{
				plan.currentTask->setup(*plan.currentTask, currentState, worldQuerySystem);
			}

			if (plan.currentTask->loop)
			{
				plan.currentTask->loop(currentState, worldQuerySystem, *plan.currentTask);
			}

			plan.currentTask++;	

			if (plan.currentTask->identifier != TaskIdentifier::Null
				&& *plan.currentPathVertex != plan.currentTask->identifier)
			{
				plan.currentPathVertex++;
			}

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
			log("[", worldQuerySystem.getName(), "] ", "Started task: ", plan.currentTask->debugName);
#endif

			if (plan.currentTask->setup)
			{
				plan.currentTask->setup(*plan.currentTask, currentState, worldQuerySystem);
			}

			return;
		}

		//are we done with the current task?
		if ((plan.currentTask->postconditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates)
			|| (!plan.currentTask->breakConditions.isEmpty() && plan.currentTask->breakConditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates)))
			&& !plan.currentTask->failed)
		{	
#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
			log("[", worldQuerySystem.getName(), "] ", "Finished task: ", plan.currentTask->debugName);
#endif

			if (plan.currentTask->finish)
			{
				plan.currentTask->finish(currentState, *plan.currentTask);
			}

			//is this the last task in an abstract implementation or a compound task?
			if (plan.currentTask->parentTaskIndex != -1)
			{		
				auto& parent = plan.tasks[plan.currentTask->parentTaskIndex];		

				if (parent.type == TaskType::Abstract) 
				{
					if (!parent.postconditions.isTrue(currentState, parent, satisfiablePredicates))
					{
						log("[", worldQuerySystem.getName(), "] ", "Abstract task: ", parent.debugName, " finished but its postconditions are not met");
						plan.failed = true;

						return;
					}
				}
				else if (parent.type == TaskType::Compound && plan.currentTask->isLastInCompound) 
				{
					if (!parent.postconditions.isTrue(currentState, parent, satisfiablePredicates)) 
					{
						log("[", worldQuerySystem.getName(), "] ", "Compound task: ", parent.debugName, " finished but its postconditions were not met");
						plan.failed = true;

						return;
					}
				}
				else if (parent.type == TaskType::Recursive && plan.currentTask->isLastInCompound)
				{
					if (!parent.postconditions.isTrue(currentState, parent, satisfiablePredicates)) 
					{
						if (parent.remainingRepeats > 0)
						{
							parent.remainingRepeats--;

							log("[", worldQuerySystem.getName(), "] ", "Recursive task: ", parent.debugName, " finished, starting over since postconditions were not met");
							plan.currentTask = begin(plan.tasks) + plan.currentTask->parentTaskIndex;
							evaluatePlan(plan, currentState, worldQuerySystem, parameters, satisfiablePredicates);
						}
						else
						{
							log("[", worldQuerySystem.getName(), "] ", "Recursive task: ", parent.debugName, " failed, postconditions not met and remainingRepeats");
							plan.failed = true;
						}

						return;
					}
					else
					{
						log("[", worldQuerySystem.getName(), "] ", "Recursive task: ", parent.debugName, " has finished");
					}
				}				
			}

			//is there a next task?
			if ((plan.currentTask + 1) < end(plan.tasks))
			{
				//can we move to the next task?
				plan.currentTask++;

				if (plan.currentTask->identifier != TaskIdentifier::Null
					&& *plan.currentPathVertex != plan.currentTask->identifier)
				{
					plan.currentPathVertex++;
				}

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
				log("[", worldQuerySystem.getName(), "] ", "Started task: ", plan.currentTask->debugName);
#endif

				if (plan.currentTask->setup)
				{
					plan.currentTask->setup(*plan.currentTask, currentState, worldQuerySystem);
				}

				if (plan.currentTask->preconditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates)) 
				{
					return;
				}
				else
				{
					log("[", worldQuerySystem.getName(), "] ", plan.currentTask->debugName, " preconditions false, plan failed");
					plan.failed = true;					
				}
			}
			else
			{

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
				log("[", worldQuerySystem.getName(), "] ", "Plan finished successfully");
#endif

				plan.failed = false;
				plan.finished = true;			
			}			
		}
		else
		{
			//can we still do this task?
			if (plan.currentTask->preconditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates) 
				&& !plan.currentTask->isImmediate && !plan.currentTask->failed)
			{
				return;
			}
			else
			{
				log("[", worldQuerySystem.getName(), "] ", plan.currentTask->debugName, " preconditions false, plan failed");
				plan.failed = true;
			}
		}
	}